

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O1

void __thiscall
duckdb::BuildProbeSideOptimizer::TryFlipJoinChildren
          (BuildProbeSideOptimizer *this,LogicalOperator *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  pointer pCVar1;
  int iVar2;
  reference pvVar3;
  type pLVar4;
  type pLVar5;
  idx_t lhs_cardinality;
  undefined4 extraout_var_00;
  type pLVar6;
  idx_t iVar7;
  idx_t iVar8;
  __normal_iterator<const_duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
  _Var9;
  ColumnBinding *needle;
  pointer pCVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  BuildSize BVar17;
  vector<duckdb::ColumnBinding,_true> bindings_right;
  vector<duckdb::ColumnBinding,_true> bindings_left;
  void *local_60;
  ColumnBinding *local_58;
  void *local_48;
  ColumnBinding *local_40;
  idx_t rhs_cardinality;
  undefined4 extraout_var;
  
  this_00 = &op->children;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  if (pLVar4->has_estimated_cardinality == true) {
    lhs_cardinality = pLVar4->estimated_cardinality;
  }
  else {
    iVar2 = (*pLVar4->_vptr_LogicalOperator[7])(pLVar4,this->context);
    lhs_cardinality = CONCAT44(extraout_var,iVar2);
  }
  if (pLVar5->has_estimated_cardinality == true) {
    rhs_cardinality = pLVar5->estimated_cardinality;
  }
  else {
    iVar2 = (*pLVar5->_vptr_LogicalOperator[7])(pLVar5,this->context);
    rhs_cardinality = CONCAT44(extraout_var_00,iVar2);
  }
  BVar17 = GetBuildSizes(op,lhs_cardinality,rhs_cardinality);
  dVar16 = BVar17.right_side;
  dVar14 = BVar17.left_side;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  iVar7 = ChildHasJoins(pLVar6);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar3);
  iVar8 = ChildHasJoins(pLVar6);
  dVar15 = dVar16;
  if (iVar8 == 0) {
    dVar15 = dVar16 * 1.15;
  }
  if (iVar7 == 0) {
    dVar15 = dVar16;
  }
  bVar11 = dVar14 < dVar15;
  if ((rhs_cardinality == lhs_cardinality) &&
     ((this->preferred_on_probe_side).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->preferred_on_probe_side).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    (*pLVar4->_vptr_LogicalOperator[2])(&local_48,pLVar4);
    (*pLVar5->_vptr_LogicalOperator[2])(&local_60,pLVar5);
    pCVar1 = (this->preferred_on_probe_side).
             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar12 = 0;
    for (pCVar10 = (this->preferred_on_probe_side).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar1;
        pCVar10 = pCVar10 + 1) {
      _Var9 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding_const*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::ColumnBinding_const>>
                        (local_48,local_40,pCVar10);
      uVar12 = uVar12 + (_Var9._M_current != local_40);
    }
    pCVar1 = (this->preferred_on_probe_side).
             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar13 = 0;
    for (pCVar10 = (this->preferred_on_probe_side).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar1;
        pCVar10 = pCVar10 + 1) {
      _Var9 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding_const*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::ColumnBinding_const>>
                        (local_60,local_58,pCVar10);
      uVar13 = uVar13 + (_Var9._M_current != local_58);
    }
    if (local_60 != (void *)0x0) {
      operator_delete(local_60);
    }
    if (local_48 != (void *)0x0) {
      operator_delete(local_48);
    }
    bVar11 = dVar14 < dVar15 !=
             (uVar13 < uVar12 && dVar14 < dVar15 || uVar12 < uVar13 && dVar15 <= dVar14);
  }
  if (bVar11) {
    FlipChildren(op);
  }
  return;
}

Assistant:

void BuildProbeSideOptimizer::TryFlipJoinChildren(LogicalOperator &op) const {
	auto &left_child = *op.children[0];
	auto &right_child = *op.children[1];
	const auto lhs_cardinality = left_child.has_estimated_cardinality ? left_child.estimated_cardinality
	                                                                  : left_child.EstimateCardinality(context);
	const auto rhs_cardinality = right_child.has_estimated_cardinality ? right_child.estimated_cardinality
	                                                                   : right_child.EstimateCardinality(context);

	auto build_sizes = GetBuildSizes(op, lhs_cardinality, rhs_cardinality);
	auto &left_side_build_cost = build_sizes.left_side;
	auto &right_side_build_cost = build_sizes.right_side;

	bool swap = false;

	idx_t left_child_joins = ChildHasJoins(*op.children[0]);
	idx_t right_child_joins = ChildHasJoins(*op.children[1]);
	// if the right child is a table scan, and the left child has joins, we should prefer the left child
	// to be the build side. Since the tuples of the left side will already have been built on/be in flight,
	// it will be faster to build on them again.
	if (right_child_joins == 0 && left_child_joins > 0) {
		right_side_build_cost *= (1 + PREFER_RIGHT_DEEP_PENALTY);
	}

	// RHS is build side.
	// if right_side metric is larger than left_side metric, then right_side is more costly to build on
	// than the lhs. So we swap
	if (right_side_build_cost > left_side_build_cost) {
		swap = true;
	}

	// swap for preferred on probe side
	if (rhs_cardinality == lhs_cardinality && !preferred_on_probe_side.empty()) {
		// inspect final bindings, we prefer them on the probe side
		auto bindings_left = left_child.GetColumnBindings();
		auto bindings_right = right_child.GetColumnBindings();
		auto bindings_in_left = ComputeOverlappingBindings(bindings_left, preferred_on_probe_side);
		auto bindings_in_right = ComputeOverlappingBindings(bindings_right, preferred_on_probe_side);
		// (if the sides are planning to be swapped AND
		// if more projected bindings are in the left (meaning right/build side after the swap)
		// then swap them back. The projected bindings stay in the left/probe side.)
		// OR
		// (if the sides are planning not to be swapped AND
		// if more projected bindings are in the right (meaning right/build)
		// then swap them. The projected bindings are swapped to the left/probe side.)
		if ((swap && bindings_in_left > bindings_in_right) || (!swap && bindings_in_right > bindings_in_left)) {
			swap = !swap;
		}
	}

	if (swap) {
		FlipChildren(op);
	}
}